

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_for_loop(jit_State *J,BCIns *fori,ScEvEntry *scev,int init)

{
  byte bVar1;
  TRef TVar2;
  TRef step;
  uint uVar3;
  TRef *pTVar4;
  int in_R8D;
  IRType t;
  cTValue *tv;
  bool bVar5;
  
  bVar1 = *(byte *)((long)fori + 1);
  tv = (cTValue *)((ulong)((uint)bVar1 * 8) + (long)J->L->base);
  uVar3 = J->base[bVar1];
  if (uVar3 == 0) {
    if (init == 0) {
      t = IRT_NUM;
    }
    else {
      t = lj_opt_narrow_forl(J,tv);
    }
  }
  else {
    t = uVar3 >> 0x18 & IRT_TYPE;
  }
  TVar2 = fori_arg(J,fori,bVar1 + 1,t,in_R8D);
  step = fori_arg(J,fori,bVar1 + 2,t,in_R8D);
  bVar5 = -1 < *(int *)((long)tv + 0x14);
  (scev->t).irt = (uint8_t)t;
  scev->dir = bVar5;
  scev->stop = (IRRef1)TVar2;
  scev->step = (IRRef1)step;
  rec_for_check(J,t,(uint)bVar5,TVar2,step,init);
  TVar2 = find_kinit(J,fori,(uint)bVar1,IRT_INT);
  scev->start = (IRRef1)TVar2;
  if (uVar3 == 0) {
    uVar3 = fori_load(J,(uint)bVar1,t,(uint)(J->scev).start << 0x10 | 0x20);
  }
  if (init == 0) {
    (J->fold).ins.field_0.ot = (ushort)t | 0x2800;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)step;
    uVar3 = lj_opt_fold(J);
    pTVar4 = J->base;
    pTVar4[bVar1] = uVar3;
  }
  else {
    pTVar4 = J->base;
  }
  pTVar4[(ulong)bVar1 + 3] = uVar3;
  scev->idx = (IRRef1)uVar3;
  (scev->pc).ptr32 = (uint32_t)fori;
  J->maxslot = bVar1 + 4;
  return;
}

Assistant:

static void rec_for_loop(jit_State *J, const BCIns *fori, ScEvEntry *scev,
			 int init)
{
  BCReg ra = bc_a(*fori);
  cTValue *tv = &J->L->base[ra];
  TRef idx = J->base[ra+FORL_IDX];
  IRType t = idx ? tref_type(idx) :
	     (init || LJ_DUALNUM) ? lj_opt_narrow_forl(J, tv) : IRT_NUM;
  int mode = IRSLOAD_INHERIT +
    ((!LJ_DUALNUM || tvisint(tv) == (t == IRT_INT)) ? IRSLOAD_READONLY : 0);
  TRef stop = fori_arg(J, fori, ra+FORL_STOP, t, mode);
  TRef step = fori_arg(J, fori, ra+FORL_STEP, t, mode);
  int tc, dir = rec_for_direction(&tv[FORL_STEP]);
  lua_assert(bc_op(*fori) == BC_FORI || bc_op(*fori) == BC_JFORI);
  scev->t.irt = t;
  scev->dir = dir;
  scev->stop = tref_ref(stop);
  scev->step = tref_ref(step);
  rec_for_check(J, t, dir, stop, step, init);
  scev->start = tref_ref(find_kinit(J, fori, ra+FORL_IDX, IRT_INT));
  tc = (LJ_DUALNUM &&
	!(scev->start && irref_isk(scev->stop) && irref_isk(scev->step) &&
	  tvisint(&tv[FORL_IDX]) == (t == IRT_INT))) ?
	IRSLOAD_TYPECHECK : 0;
  if (tc) {
    J->base[ra+FORL_STOP] = stop;
    J->base[ra+FORL_STEP] = step;
  }
  if (!idx)
    idx = fori_load(J, ra+FORL_IDX, t,
		    IRSLOAD_INHERIT + tc + (J->scev.start << 16));
  if (!init)
    J->base[ra+FORL_IDX] = idx = emitir(IRT(IR_ADD, t), idx, step);
  J->base[ra+FORL_EXT] = idx;
  scev->idx = tref_ref(idx);
  setmref(scev->pc, fori);
  J->maxslot = ra+FORL_EXT+1;
}